

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O3

TextFile * __thiscall asl::TextFile::operator>>(TextFile *this,String *x)

{
  int iVar1;
  size_t sVar2;
  FILE *pFVar3;
  char s [256];
  char acStack_118 [256];
  
  pFVar3 = (this->super_File)._file;
  if (pFVar3 == (FILE *)0x0) {
    iVar1 = File::open(&this->super_File,(char *)&(this->super_File)._path,8);
    pFVar3 = (this->super_File)._file;
    if ((pFVar3 != (FILE *)0x0 & (byte)iVar1) != 1) {
      return this;
    }
  }
  __isoc99_fscanf(pFVar3,"%255s",acStack_118);
  sVar2 = strlen(acStack_118);
  String::assign(x,acStack_118,(int)sVar2);
  return this;
}

Assistant:

TextFile& TextFile::operator>>(String &x)
{
	if(!_file && !open(READ))
		return *this;
	char s[256];
	int n = fscanf(_file, "%255s", s); if (n < 1) {}
	x = &s[0];
	return *this;
}